

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O3

void Gia_ManBmcAddCone_rec(Bmc_Mna_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  long lVar3;
  uint Entry;
  
  uVar1 = *(ulong *)pObj;
  if (((uint)uVar1 >> 0x1e & 1) != 0) {
    return;
  }
  *(ulong *)pObj = uVar1 | 0x40000000;
  pGVar2 = p->pFrames->pObjs;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->pFrames->nObjs)) {
    Entry = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
    lVar3 = 0x20;
    if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar1) {
      if (((int)Entry < 0) || (p->vId2Var->nSize <= (int)Entry)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vId2Var->pArray[Entry & 0x7fffffff] == 0) {
        Gia_ManBmcAddCone_rec(p,pObj + -(uVar1 & 0x1fffffff));
        Gia_ManBmcAddCone_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
        lVar3 = 0x30;
      }
    }
    Vec_IntPush(*(Vec_Int_t **)((long)&p->pFrames + lVar3),Entry);
    return;
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManBmcAddCone_rec( Bmc_Mna_t * p, Gia_Obj_t * pObj )
{
    int iObj;
    if ( pObj->fMark0 )
        return;
    pObj->fMark0 = 1;
    iObj = Gia_ObjId( p->pFrames, pObj );
    if ( Gia_ObjIsAnd(pObj) && Vec_IntEntry(p->vId2Var, iObj) == 0 )
    {
        Gia_ManBmcAddCone_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ManBmcAddCone_rec( p, Gia_ObjFanin1(pObj) );
        Vec_IntPush( p->vNodes, iObj );
    }
    else
        Vec_IntPush( p->vInputs, iObj );
}